

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O3

int * Gia_ManTerCreateMap(Gia_ManTer_t *p,int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  int *__s;
  Vec_Int_t *p_00;
  int *__ptr;
  ulong uVar6;
  int Entry;
  size_t __size;
  long lVar7;
  uint uVar8;
  Gia_Man_t *pGVar9;
  uint local_44;
  
  uVar1 = p->vStates->nSize;
  pVVar5 = Gia_ManTerTranspose(p);
  p->vFlops = pVVar5;
  pGVar9 = p->pAig;
  __size = (long)pGVar9->vCis->nSize << 2;
  __s = (int *)malloc(__size);
  memset(__s,0xff,__size);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  __ptr = (int *)malloc(400);
  p_00->pArray = __ptr;
  uVar6 = (ulong)(uint)pGVar9->nRegs;
  if (pGVar9->nRegs < 1) {
    uVar8 = 0;
    local_44 = 0;
  }
  else {
    lVar7 = 0;
    local_44 = 0;
    uVar8 = 0;
    do {
      Entry = (int)lVar7;
      if (p->pCount0[lVar7] == p->vStates->nSize) {
        __s[(pGVar9->vCis->nSize - (int)uVar6) + Entry] = 0;
        uVar8 = uVar8 + 1;
      }
      else if (p->pCountX[lVar7] == 0) {
        uVar3 = Gia_ManFindEqualFlop
                          (p->vFlops,p_00->nSize,
                           (((int)uVar1 >> 4) + 1) - (uint)((uVar1 & 0xf) == 0));
        Vec_IntPush(p_00,Entry);
        pGVar9 = p->pAig;
        if (-1 < (int)uVar3) {
          if (p_00->nSize <= (int)uVar3) {
LAB_0023d3ac:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar2 = pGVar9->vCis->nSize;
          iVar4 = iVar2 - pGVar9->nRegs;
          uVar3 = p_00->pArray[uVar3] + iVar4;
          if (((int)uVar3 < 0) || (iVar2 <= (int)uVar3)) goto LAB_0023d3ac;
          iVar2 = pGVar9->vCis->pArray[uVar3];
          if ((iVar2 < 0) || (pGVar9->nObjs <= iVar2)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          __s[iVar4 + Entry] = iVar2 * 2;
          local_44 = local_44 + 1;
        }
      }
      lVar7 = lVar7 + 1;
      uVar6 = (ulong)pGVar9->nRegs;
    } while (lVar7 < (long)uVar6);
    __ptr = p_00->pArray;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(p_00);
  if (fVerbose != 0) {
    printf("Transforming %d const and %d equiv registers.\n",(ulong)uVar8,(ulong)local_44);
  }
  return __s;
}

Assistant:

int * Gia_ManTerCreateMap( Gia_ManTer_t * p, int fVerbose )
{
    int * pCi2Lit;
    Gia_Obj_t * pObj;
    Vec_Int_t * vMapKtoI;
    int i, iRepr, nFlopWords, Counter0 = 0, CounterE = 0;
    nFlopWords = Abc_BitWordNum( 2*Vec_PtrSize(p->vStates) );
    p->vFlops = Gia_ManTerTranspose( p );
    pCi2Lit = ABC_FALLOC( int, Gia_ManCiNum(p->pAig) );
    vMapKtoI = Vec_IntAlloc( 100 );
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        if ( p->pCount0[i] == Vec_PtrSize(p->vStates) )
            pCi2Lit[Gia_ManPiNum(p->pAig)+i] = 0, Counter0++;
        else if ( p->pCountX[i] == 0 )
        {
            iRepr = Gia_ManFindEqualFlop( p->vFlops, Vec_IntSize(vMapKtoI), nFlopWords );
            Vec_IntPush( vMapKtoI, i );
            if ( iRepr < 0 )
                continue;
            pObj = Gia_ManCi( p->pAig, Gia_ManPiNum(p->pAig)+Vec_IntEntry(vMapKtoI, iRepr) );
            pCi2Lit[Gia_ManPiNum(p->pAig)+i] = Abc_Var2Lit( Gia_ObjId( p->pAig, pObj ), 0 );
            CounterE++;
        }
    Vec_IntFree( vMapKtoI );
    if ( fVerbose )
        printf( "Transforming %d const and %d equiv registers.\n", Counter0, CounterE );
    return pCi2Lit;
}